

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O2

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::
_dtFromPseudoVarType<yactfr::VariantWithUnsignedIntegerSelectorType,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>>
          (DtFromPseudoRootDtConverter *this,PseudoVarType *pseudoVarType,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
          *selTypeMappings,DataLocation *selLoc)

{
  __buckets_ptr pp_Var1;
  undefined8 uVar2;
  Up UVar3;
  bool bVar4;
  mapped_type *pmVar5;
  reference_const_type pbVar6;
  const_iterator cVar7;
  ostream *poVar8;
  _Rb_tree_header *p_Var9;
  uint uVar10;
  ulong uVar11;
  DtFromPseudoRootDtConverter *pDVar12;
  DataLocation *in_R8;
  Options opts;
  ostringstream ss;
  undefined1 local_220 [16];
  StructureType *local_210;
  _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_208;
  undefined1 local_200 [56];
  undefined1 local_1c8 [32];
  DtFromPseudoRootDtConverter local_1a8 [3];
  
  local_220._8_8_ = in_R8;
  local_200._32_8_ = this;
  bVar4 = _intTypeMappingsOverlap<std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
                      *)selLoc);
  if (bVar4) {
    pDVar12 = local_1a8;
    std::__cxx11::string::string
              ((string *)pDVar12,"Selector type of variant type contains overlapping mappings.",
               (allocator *)local_200);
    p_Var9 = &(selTypeMappings->_M_t)._M_impl.super__Rb_tree_header;
    _throwInvalDataLoc(pDVar12,(string *)local_1a8,(TextLocation *)p_Var9,
                       (DataLocation *)local_220._8_8_,(TextLocation *)p_Var9);
  }
  local_1c8._16_8_ = 0;
  local_1c8._0_8_ = (_Hash_node_base *)0x0;
  local_1c8._8_8_ = 0;
  local_208 = (_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&(pseudoVarType->super_PseudoDt)._posInScope.super_type.m_storage;
  local_200._48_8_ = &selLoc->_pathElems;
  uVar10 = 0;
  local_210 = (StructureType *)selTypeMappings;
  local_200._40_8_ = pseudoVarType;
  while( true ) {
    uVar11 = (ulong)uVar10;
    local_1a8[0]._dt._M_t.
    super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
    .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>,_true,_true>
            )selTypeMappings;
    if ((ulong)((long)((((StructureType *)selTypeMappings)->_namesToMemberTypes)._M_h.
                       _M_bucket_count -
                      (long)(((StructureType *)selTypeMappings)->_namesToMemberTypes)._M_h.
                            _M_buckets) >> 3) <= uVar11) {
      std::
      _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(local_208);
      local_220._0_4_ = 1;
      tryCloneAttrs((MapItem *)local_200);
      std::
      make_unique<yactfr::VariantWithUnsignedIntegerSelectorType_const,int,std::vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>,yactfr::DataLocation_const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((int *)local_1a8,
                 (vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                  *)local_220,(DataLocation *)(local_200 + 0x38),
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 local_220._8_8_);
      UVar3._M_t.
      super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
      .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
           local_1a8[0]._dt._M_t.
           super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
           .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl;
      uVar2 = local_200._32_8_;
      local_1a8[0]._dt._M_t.
      super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
      .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
           (__uniq_ptr_data<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>,_true,_true>
            )(__uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              )0x0;
      *(_func_int ***)local_200._32_8_ =
           (_func_int **)
           UVar3._M_t.
           super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
           .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl;
      std::
      unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
      ::~unique_ptr((unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
                     *)local_1a8);
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_200);
      std::
      vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
      ::~vector((vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                 *)(local_200 + 0x38));
      return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
              )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
                )uVar2;
    }
    pmVar5 = std::__detail::
             _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_208,(key_type *)local_1a8);
    *pmVar5 = uVar11;
    pp_Var1 = (((StructureType *)selTypeMappings)->_namesToMemberTypes)._M_h._M_buckets;
    if (*(char *)&pp_Var1[uVar11][1]._M_nxt == '\0') break;
    pbVar6 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(pp_Var1[uVar11] + 1));
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
                    *)selLoc,pbVar6);
    if (cVar7._M_node == (_Base_ptr)local_200._48_8_) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar8 = std::operator<<((ostream *)local_1a8,
                               "Selector type of variant type has no mapping named `");
      pbVar6 = boost::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(pp_Var1[uVar11] + 1));
      poVar8 = std::operator<<(poVar8,(string *)pbVar6);
      std::operator<<(poVar8,"`.");
      pDVar12 = (DtFromPseudoRootDtConverter *)local_200;
      std::__cxx11::stringbuf::str();
      p_Var9 = &(((_Rep_type *)&local_210->super_CompoundDataType)->_M_impl).super__Rb_tree_header;
      _throwInvalDataLoc(pDVar12,(string *)local_200,(TextLocation *)p_Var9,
                         (DataLocation *)local_220._8_8_,(TextLocation *)p_Var9);
    }
    pbVar6 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(pp_Var1[uVar11] + 1));
    _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_200,(PseudoDt *)local_200._40_8_);
    tryCloneAttrs((MapItem *)local_220);
    std::
    make_unique<yactfr::VariantTypeOption<unsigned_long_long>const,std::__cxx11::string_const&,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::IntegerRangeSet<unsigned_long_long,true>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               pbVar6,(IntegerRangeSet<unsigned_long_long,_true> *)local_200,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               (cVar7._M_node + 2));
    std::
    vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
    ::
    emplace_back<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>
              ((vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
                *)(local_200 + 0x38),
               (unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                *)local_1a8);
    selTypeMappings =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
          *)local_210;
    std::
    unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
    ::~unique_ptr((unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                   *)local_1a8);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_220);
    if ((StructureType *)local_200._0_8_ != (StructureType *)0x0) {
      (**(code **)(*(long *)local_200._0_8_ + 8))();
    }
    uVar10 = uVar10 + 1;
  }
  __assert_fail("pseudoOpt->name()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                ,0x17d,
                "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoVarType(const PseudoVarType &, const MappingsT &, const DataLocation &) [VarTypeT = yactfr::VariantWithUnsignedIntegerSelectorType, MappingsT = std::map<std::basic_string<char>, yactfr::IntegerRangeSet<unsigned long long>>]"
               );
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoVarType(const PseudoVarType& pseudoVarType,
                                                               const MappingsT& selTypeMappings,
                                                               const DataLocation& selLoc)
{
    // validate that the selector type has no overlapping mappings
    if (this->_intTypeMappingsOverlap(selTypeMappings)) {
        this->_throwInvalDataLoc("Selector type of variant type contains overlapping mappings.",
                                 pseudoVarType.loc(), selLoc, pseudoVarType.loc());
    }

    typename VarTypeT::Options opts;

    for (auto i = 0U; i < pseudoVarType.pseudoOpts().size(); ++i) {
        // currently being visited
        _current[&pseudoVarType] = i;

        const auto& pseudoOpt = pseudoVarType.pseudoOpts()[i];

        assert(pseudoOpt->name());

        const auto rangesIt = selTypeMappings.find(*pseudoOpt->name());

        // validate that the range set exists
        if (rangesIt == selTypeMappings.end()) {
            std::ostringstream ss;

            ss << "Selector type of variant type has no mapping named `" <<
                  *pseudoOpt->name() << "`.";
            this->_throwInvalDataLoc(ss.str(), pseudoVarType.loc(), selLoc, pseudoVarType.loc());
        }

        opts.push_back(VarTypeT::Option::create(*pseudoOpt->name(),
                                                this->_dtFromPseudoDt(pseudoOpt->pseudoDt()),
                                                rangesIt->second,
                                                this->_tryCloneAttrs(pseudoOpt->attrs())));
    }

    // not visited anymore
    _current.erase(&pseudoVarType);

    return VarTypeT::create(1, std::move(opts), selLoc,
                            this->_tryCloneAttrs(pseudoVarType.attrs()));
}